

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

double bsc_L(bsc_request_t type)

{
  bsc_request_t type_local;
  
  if ((s_L[0] == 0.0) && (!NAN(s_L[0]))) {
    load_param_L_once();
  }
  return s_L[type];
}

Assistant:

double bsc_L(bsc_request_t type)
{
    if ( s_L[0] == 0.0 ) {
        load_param_L_once();
    }
    return s_L[type];
}